

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O0

string * __thiscall
jaegertracing::net::IPAddress::authority_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  string local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  IPAddress *pIStack_18;
  int portNum;
  IPAddress *this_local;
  
  pIStack_18 = this;
  this_local = (IPAddress *)__return_storage_ptr__;
  local_1c = port(this);
  if (local_1c == 0) {
    host_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    host_abi_cxx11_(&local_60,this);
    std::operator+(&local_40,&local_60,':');
    std::__cxx11::to_string(&local_90,local_1c);
    std::operator+(__return_storage_ptr__,&local_40,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string authority() const
    {
        const auto portNum = port();
        if (portNum != 0) {
            return host() + ':' + std::to_string(portNum);
        }
        return host();
    }